

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  setDocumentLocatorSAXFunc p_Var2;
  void *pvVar3;
  startDocumentSAXFunc p_Var4;
  xmlParserInputBufferPtr pxVar5;
  externalSubsetSAXFunc p_Var6;
  endDocumentSAXFunc p_Var7;
  xmlDocPtr pxVar8;
  xmlCharEncoding enc;
  int iVar9;
  undefined8 in_RAX;
  xmlSAXLocator *pxVar10;
  xmlChar *pxVar11;
  xmlParserInputPtr pxVar12;
  xmlChar xVar13;
  uint uVar14;
  int iVar15;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xmlInitParser();
  iVar15 = -1;
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar12 = ctxt->input, pxVar12 != (xmlParserInputPtr)0x0))
  {
    if ((ctxt->progressive == 0) && ((long)pxVar12->end - (long)pxVar12->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlDetectSAX2(ctxt);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var2 = ctxt->sax->setDocumentLocator, p_Var2 != (setDocumentLocatorSAXFunc)0x0)) {
      pvVar3 = ctxt->userData;
      pxVar10 = __xmlDefaultSAXLocator();
      (*p_Var2)(pvVar3,pxVar10);
    }
    if (ctxt->instate != XML_PARSER_EOF) {
      if ((ctxt->encoding == (xmlChar *)0x0) &&
         (pxVar11 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar11)) {
        uStack_28 = CONCAT44(*(undefined4 *)pxVar11,(undefined4)uStack_28);
        enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
        if (enc != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(ctxt,enc);
        }
      }
      pxVar11 = ctxt->input->cur;
      xVar13 = *pxVar11;
      if (xVar13 == '\0') {
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      }
      else {
        if (((long)ctxt->input->end - (long)pxVar11 < 0x23) && (ctxt->progressive == 0)) {
          xmlGROW(ctxt);
          pxVar11 = ctxt->input->cur;
          xVar13 = *pxVar11;
        }
        if ((((((xVar13 == '<') && (pxVar11[1] == '?')) && (pxVar11[2] == 'x')) &&
             ((pxVar11[3] == 'm' && (pxVar11[4] == 'l')))) && ((ulong)pxVar11[5] < 0x21)) &&
           ((0x100002600U >> ((ulong)pxVar11[5] & 0x3f) & 1) != 0)) {
          xmlParseXMLDecl(ctxt);
          if (ctxt->errNo == 0x20) {
            return -1;
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return -1;
          }
          ctxt->standalone = ctxt->input->standalone;
          xmlSkipBlankChars(ctxt);
        }
        else {
          pxVar11 = xmlCharStrdup("1.0");
          ctxt->version = pxVar11;
        }
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (p_Var4 = ctxt->sax->startDocument, p_Var4 != (startDocumentSAXFunc)0x0)) &&
           (ctxt->disableSAX == 0)) {
          (*p_Var4)(ctxt->userData);
        }
        if (ctxt->instate != XML_PARSER_EOF) {
          if ((((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
              (pxVar5 = ctxt->input->buf, pxVar5 != (xmlParserInputBufferPtr)0x0)) &&
             (iVar9 = pxVar5->compressed, -1 < iVar9)) {
            ctxt->myDoc->compression = iVar9;
          }
          xmlParseMisc(ctxt);
          pxVar12 = ctxt->input;
          if ((ctxt->progressive == 0) && ((long)pxVar12->end - (long)pxVar12->cur < 0xfa)) {
            xmlGROW(ctxt);
            pxVar12 = ctxt->input;
          }
          pxVar11 = pxVar12->cur;
          if (((*pxVar11 == '<') && (pxVar11[1] == '!')) &&
             (((pxVar11[2] == 'D' &&
               (((pxVar11[3] == 'O' && (pxVar11[4] == 'C')) && (pxVar11[5] == 'T')))) &&
              (((pxVar11[6] == 'Y' && (pxVar11[7] == 'P')) && (pxVar11[8] == 'E')))))) {
            ctxt->inSubset = 1;
            xmlParseDocTypeDecl(ctxt);
            if (*ctxt->input->cur == '[') {
              ctxt->instate = XML_PARSER_DTD;
              xmlParseInternalSubset(ctxt);
              if (ctxt->instate == XML_PARSER_EOF) {
                return -1;
              }
            }
            ctxt->inSubset = 2;
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var6 = ctxt->sax->externalSubset, p_Var6 != (externalSubsetSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              (*p_Var6)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return -1;
            }
            ctxt->inSubset = 0;
            xmlCleanSpecialAttr(ctxt);
            ctxt->instate = XML_PARSER_PROLOG;
            xmlParseMisc(ctxt);
            pxVar12 = ctxt->input;
          }
          if ((ctxt->progressive == 0) && ((long)pxVar12->end - (long)pxVar12->cur < 0xfa)) {
            xmlGROW(ctxt);
            pxVar12 = ctxt->input;
          }
          if (*pxVar12->cur == '<') {
            ctxt->instate = XML_PARSER_CONTENT;
            xmlParseElement(ctxt);
            ctxt->instate = XML_PARSER_EPILOG;
            xmlParseMisc(ctxt);
            if (*ctxt->input->cur != '\0') {
              xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
            }
            ctxt->instate = XML_PARSER_EOF;
          }
          else {
            xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
          }
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var7 = ctxt->sax->endDocument, p_Var7 != (endDocumentSAXFunc)0x0)) {
            (*p_Var7)(ctxt->userData);
          }
          if ((ctxt->myDoc != (xmlDocPtr)0x0) &&
             (iVar9 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document")
             , iVar9 != 0)) {
            xmlFreeDoc(ctxt->myDoc);
            ctxt->myDoc = (xmlDocPtr)0x0;
          }
          if (ctxt->wellFormed == 0) {
            ctxt->valid = 0;
          }
          else {
            pxVar8 = ctxt->myDoc;
            iVar15 = 0;
            if (pxVar8 != (xmlDocPtr)0x0) {
              uVar1 = pxVar8->properties;
              uVar14 = uVar1 | 1;
              pxVar8->properties = uVar14;
              if (ctxt->valid != 0) {
                uVar14 = uVar1 | 9;
                pxVar8->properties = uVar14;
              }
              if (ctxt->nsWellFormed != 0) {
                uVar14 = uVar14 | 2;
                pxVar8->properties = uVar14;
              }
              if ((ctxt->options & 0x20000) != 0) {
                pxVar8->properties = uVar14 | 4;
              }
            }
          }
        }
      }
    }
  }
  return iVar15;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;

    xmlInitParser();

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlDetectSAX2(ctxt);

    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    if ((ctxt->encoding == NULL) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }


    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     * do not GROW here to avoid the detected encoder to decode more
     * than just the first line, unless the amount of data is really
     * too small to hold "<?xml version="1.0" encoding="foo"
     */
    if ((ctxt->input->end - ctxt->input->cur) < 35) {
       GROW;
    }
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	if ((ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) ||
	    (ctxt->instate == XML_PARSER_EOF)) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    return(-1);
	}
	ctxt->standalone = ctxt->input->standalone;
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    ctxt->instate = XML_PARSER_DTD;
	    xmlParseInternalSubset(ctxt);
	    if (ctxt->instate == XML_PARSER_EOF)
		return(-1);
	}

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	if (ctxt->instate == XML_PARSER_EOF)
	    return(-1);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	ctxt->instate = XML_PARSER_PROLOG;
	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
	xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
		       "Start tag expected, '<' not found\n");
    } else {
	ctxt->instate = XML_PARSER_CONTENT;
	xmlParseElement(ctxt);
	ctxt->instate = XML_PARSER_EPILOG;


	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

	if (RAW != 0) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	ctxt->instate = XML_PARSER_EOF;
    }

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    /*
     * Remove locally kept entity definitions if the tree was not built
     */
    if ((ctxt->myDoc != NULL) &&
	(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
	xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }

    if ((ctxt->wellFormed) && (ctxt->myDoc != NULL)) {
        ctxt->myDoc->properties |= XML_DOC_WELLFORMED;
	if (ctxt->valid)
	    ctxt->myDoc->properties |= XML_DOC_DTDVALID;
	if (ctxt->nsWellFormed)
	    ctxt->myDoc->properties |= XML_DOC_NSVALID;
	if (ctxt->options & XML_PARSE_OLD10)
	    ctxt->myDoc->properties |= XML_DOC_OLD10;
    }
    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }
    return(0);
}